

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

void Fra_OneHotAddKnownConstraint(Fra_Man_t *p,Vec_Ptr_t *vOnehots)

{
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  lit local_4c;
  lit local_48;
  int pLits [2];
  int Out2;
  int Out1;
  int j;
  int i;
  int k;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Vec_Int_t *vGroup;
  Vec_Ptr_t *vOnehots_local;
  Fra_Man_t *p_local;
  
  j = 0;
  do {
    iVar1 = Vec_PtrSize(vOnehots);
    if (iVar1 <= j) {
      return;
    }
    p_00 = (Vec_Int_t *)Vec_PtrEntry(vOnehots,j);
    for (Out1 = 0; iVar1 = Vec_IntSize(p_00), Out1 < iVar1; Out1 = Out1 + 1) {
      pLits[1] = Vec_IntEntry(p_00,Out1);
      Out2 = Out1;
      while( true ) {
        Out2 = Out2 + 1;
        iVar1 = Vec_IntSize(p_00);
        if (iVar1 <= Out2) break;
        pLits[0] = Vec_IntEntry(p_00,Out2);
        pObj = Aig_ManCi(p->pManFraig,pLits[1]);
        pObj_00 = Aig_ManCi(p->pManFraig,pLits[0]);
        iVar1 = Fra_ObjSatNum(pObj);
        local_4c = toLitCond(iVar1,1);
        iVar1 = Fra_ObjSatNum(pObj_00);
        local_48 = toLitCond(iVar1,1);
        iVar1 = sat_solver_addclause(p->pSat,&local_4c,pLits);
        if (iVar1 == 0) {
          printf("Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.\n");
          sat_solver_delete(p->pSat);
          p->pSat = (sat_solver *)0x0;
          return;
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

void Fra_OneHotAddKnownConstraint( Fra_Man_t * p, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vGroup;
    Aig_Obj_t * pObj1, * pObj2;
    int k, i, j, Out1, Out2, pLits[2];
    //
    // these constrants should be added to different timeframes!
    // (also note that PIs follow first - then registers)
    //
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, k )
    {
        Vec_IntForEachEntry( vGroup, Out1, i )
        Vec_IntForEachEntryStart( vGroup, Out2, j, i+1 )
        {
            pObj1 = Aig_ManCi( p->pManFraig, Out1 );
            pObj2 = Aig_ManCi( p->pManFraig, Out2 );
            pLits[0] = toLitCond( Fra_ObjSatNum(pObj1), 1 );
            pLits[1] = toLitCond( Fra_ObjSatNum(pObj2), 1 );
            // add constraint to solver
            if ( !sat_solver_addclause( p->pSat, pLits, pLits + 2 ) )
            {
                printf( "Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.\n" );
                sat_solver_delete( p->pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
}